

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O3

void __thiscall
TTD::ExecutionInfoManager::GetTimeAndPositionForDebugger
          (ExecutionInfoManager *this,TTDebuggerSourceLocation *sourceLocation)

{
  uint startOffset;
  SingleCallCounter *pSVar1;
  ULONG local_38;
  LONG local_34;
  ULONG srcLine;
  LONG srcColumn;
  
  pSVar1 = GetTopCallCounter(this);
  local_38 = 0;
  local_34 = -1;
  startOffset = Js::FunctionBody::GetStatementStartOffset
                          (pSVar1->Function,pSVar1->CurrentStatementIndex);
  Js::FunctionBody::GetSourceLineFromStartOffset_TTD
            (pSVar1->Function,startOffset,&local_38,&local_34);
  TTDebuggerSourceLocation::SetLocationFull
            (sourceLocation,this->m_topLevelCallbackEventTime,pSVar1->FunctionTime,pSVar1->LoopTime,
             pSVar1->Function,local_38,local_34);
  return;
}

Assistant:

void ExecutionInfoManager::GetTimeAndPositionForDebugger(TTDebuggerSourceLocation& sourceLocation) const
    {
        const SingleCallCounter& cfinfo = this->GetTopCallCounter();

        ULONG srcLine = 0;
        LONG srcColumn = -1;
        uint32 startOffset = cfinfo.Function->GetStatementStartOffset(cfinfo.CurrentStatementIndex);
        cfinfo.Function->GetSourceLineFromStartOffset_TTD(startOffset, &srcLine, &srcColumn);

        sourceLocation.SetLocationFull(this->m_topLevelCallbackEventTime, cfinfo.FunctionTime, cfinfo.LoopTime, cfinfo.Function, srcLine, srcColumn);
    }